

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

void __thiscall Parser::FinishBackgroundRegExpNodes(Parser *this)

{
  NodeDList *pNVar1;
  RegexPattern *pRVar2;
  code *pcVar3;
  NodeDList *pNVar4;
  bool bVar5;
  undefined4 *puVar6;
  ParseNode **ppPVar7;
  ParseNodeRegExp *pPVar8;
  ParseNode **ppPVar9;
  ParseNode *pPVar10;
  BackgroundParseItem *pBVar11;
  ParseNode *this_00;
  Iterator local_50;
  Iterator local_40;
  
  if (this->m_isInBackground == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2b0,"(!this->IsBackgroundParser())","!this->IsBackgroundParser()");
    if (!bVar5) goto LAB_00e68312;
    *puVar6 = 0;
  }
  if (this->fastScannedRegExpNodes == (NodeDList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2b1,"(this->fastScannedRegExpNodes)","this->fastScannedRegExpNodes");
    if (!bVar5) goto LAB_00e68312;
    *puVar6 = 0;
  }
  pBVar11 = this->backgroundParseItems;
  if (pBVar11 == (BackgroundParseItem *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2b2,"(this->backgroundParseItems != nullptr)",
                       "this->backgroundParseItems != nullptr");
    if (!bVar5) {
LAB_00e68312:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
    pBVar11 = this->backgroundParseItems;
    if (pBVar11 == (BackgroundParseItem *)0x0) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      pBVar11 = (BackgroundParseItem *)0x0;
      goto LAB_00e67f96;
    }
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    local_40.list = &pBVar11->regExpNodes->super_DListBase<ParseNode_*,_RealCount>;
    local_40.current = &(local_40.list)->super_DListNodeBase<ParseNode_*>;
    if ((NodeDList *)local_40.list != (NodeDList *)0x0) {
      while( true ) {
        if ((NodeDList *)local_40.current == (NodeDList *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar5) goto LAB_00e68312;
          *puVar6 = 0;
        }
        local_40.current =
             (((NodeDList *)local_40.current)->super_DListBase<ParseNode_*,_RealCount>).
             super_DListNodeBase<ParseNode_*>.next.base;
        if ((DListBase<ParseNode_*,_RealCount> *)local_40.current == local_40.list) break;
        ppPVar7 = DListBase<ParseNode_*,_RealCount>::Iterator::Data(&local_40);
        pPVar8 = ParseNode::AsParseNodeRegExp(*ppPVar7);
        if (pPVar8->regexPattern != (RegexPattern *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                             ,0x2bf,"(pnode->AsParseNodeRegExp()->regexPattern == nullptr)",
                             "pnode->AsParseNodeRegExp()->regexPattern == nullptr");
          if (!bVar5) goto LAB_00e68312;
          *puVar6 = 0;
        }
      }
    }
    pBVar11 = pBVar11->nextItem;
  } while (pBVar11 != (BackgroundParseItem *)0x0);
  pBVar11 = this->backgroundParseItems;
LAB_00e67f96:
  local_40.list = &this->fastScannedRegExpNodes->super_DListBase<ParseNode_*,_RealCount>;
  local_40.current = &(local_40.list)->super_DListNodeBase<ParseNode_*>;
LAB_00e67faf:
  if ((NodeDList *)local_40.current == (NodeDList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x66,"(current != nullptr)","current != nullptr");
    if (!bVar5) goto LAB_00e68312;
    *puVar6 = 0;
  }
  local_40.current =
       (((NodeDList *)local_40.current)->super_DListBase<ParseNode_*,_RealCount>).
       super_DListNodeBase<ParseNode_*>.next.base;
  if ((DListBase<ParseNode_*,_RealCount> *)local_40.current == local_40.list) {
    pBVar11 = this->backgroundParseItems;
    if (pBVar11 != (BackgroundParseItem *)0x0) {
      do {
        local_40.list = &pBVar11->regExpNodes->super_DListBase<ParseNode_*,_RealCount>;
        local_40.current = &(local_40.list)->super_DListNodeBase<ParseNode_*>;
        if ((NodeDList *)local_40.list != (NodeDList *)0x0) {
          while( true ) {
            if ((NodeDList *)local_40.current == (NodeDList *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                                 ,0x66,"(current != nullptr)","current != nullptr");
              if (!bVar5) goto LAB_00e68312;
              *puVar6 = 0;
            }
            local_40.current =
                 (((NodeDList *)local_40.current)->super_DListBase<ParseNode_*,_RealCount>).
                 super_DListNodeBase<ParseNode_*>.next.base;
            if ((DListBase<ParseNode_*,_RealCount> *)local_40.current == local_40.list) break;
            ppPVar7 = DListBase<ParseNode_*,_RealCount>::Iterator::Data(&local_40);
            pPVar8 = ParseNode::AsParseNodeRegExp(*ppPVar7);
            if (pPVar8->regexPattern == (RegexPattern *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                 ,0x306,"(pnode->AsParseNodeRegExp()->regexPattern != nullptr)",
                                 "pnode->AsParseNodeRegExp()->regexPattern != nullptr");
              if (!bVar5) goto LAB_00e68312;
              *puVar6 = 0;
            }
          }
        }
        pBVar11 = pBVar11->nextItem;
      } while (pBVar11 != (BackgroundParseItem *)0x0);
    }
    return;
  }
  ppPVar7 = DListBase<ParseNode_*,_RealCount>::Iterator::Data(&local_40);
  pPVar10 = *ppPVar7;
  if (pPVar10->nop != knopRegExp) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2d0,"(pnodeFgnd->nop == knopRegExp)","pnodeFgnd->nop == knopRegExp");
    if (!bVar5) goto LAB_00e68312;
    *puVar6 = 0;
    pPVar10 = *ppPVar7;
  }
  pPVar8 = ParseNode::AsParseNodeRegExp(pPVar10);
  if (pPVar8->regexPattern == (RegexPattern *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2d1,"(pnodeFgnd->AsParseNodeRegExp()->regexPattern != nullptr)",
                       "pnodeFgnd->AsParseNodeRegExp()->regexPattern != nullptr");
    if (!bVar5) goto LAB_00e68312;
    *puVar6 = 0;
  }
  for (; pBVar11 != (BackgroundParseItem *)0x0; pBVar11 = pBVar11->nextItem) {
    pNVar1 = pBVar11->regExpNodes;
    pNVar4 = pNVar1;
    if (pNVar1 != (NodeDList *)0x0) {
      while( true ) {
        local_50.current = (NodeBase *)pNVar4;
        local_50.list = &pNVar1->super_DListBase<ParseNode_*,_RealCount>;
        if ((NodeDList *)local_50.current == (NodeDList *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar5) goto LAB_00e68312;
          *puVar6 = 0;
        }
        pNVar1 = (NodeDList *)
                 (((DListBase<ParseNode_*,_RealCount> *)&(local_50.current)->next)->
                 super_DListNodeBase<ParseNode_*>).next.base;
        if (pNVar1 == (NodeDList *)local_50.list) break;
        local_50.current = (NodeBase *)pNVar1;
        ppPVar9 = DListBase<ParseNode_*,_RealCount>::Iterator::Data(&local_50);
        pPVar10 = *ppPVar9;
        if (pPVar10->nop != knopRegExp) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                             ,0x2e3,"(pnodeBgnd->nop == knopRegExp)","pnodeBgnd->nop == knopRegExp")
          ;
          if (!bVar5) goto LAB_00e68312;
          *puVar6 = 0;
          pPVar10 = *ppPVar9;
        }
        this_00 = *ppPVar7;
        pNVar1 = (NodeDList *)local_50.list;
        pNVar4 = (NodeDList *)local_50.current;
        if (this_00->ichMin <= pPVar10->ichMin) {
          if (this_00->ichMin != pPVar10->ichMin) goto LAB_00e67faf;
          if (this_00->ichLim != pPVar10->ichLim) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                               ,0x2eb,"(pnodeFgnd->ichLim == pnodeBgnd->ichLim)",
                               "pnodeFgnd->ichLim == pnodeBgnd->ichLim");
            if (!bVar5) goto LAB_00e68312;
            *puVar6 = 0;
            this_00 = *ppPVar7;
          }
          pPVar8 = ParseNode::AsParseNodeRegExp(this_00);
          pRVar2 = pPVar8->regexPattern;
          pPVar8 = ParseNode::AsParseNodeRegExp(*ppPVar9);
          pPVar8->regexPattern = pRVar2;
          goto LAB_00e67faf;
        }
      }
    }
  }
  pBVar11 = (BackgroundParseItem *)0x0;
  goto LAB_00e67faf;
}

Assistant:

void Parser::FinishBackgroundRegExpNodes()
{
    // We have a list of RegExp nodes that we saw on the UI thread in functions we're parallel parsing,
    // and for each background job we have a list of RegExp nodes for which we couldn't allocate patterns.
    // We need to copy the pattern pointers from the UI thread nodes to the corresponding nodes on the
    // background nodes.
    // There may be UI thread nodes for which there are no background thread equivalents, because the UI thread
    // has to assume that the background thread won't defer anything.

    // Note that because these lists (and the list of background jobs) are SList's built by prepending, they are
    // all in reverse lexical order.

    Assert(!this->IsBackgroundParser());
    Assert(this->fastScannedRegExpNodes);
    Assert(this->backgroundParseItems != nullptr);

    BackgroundParseItem *currBackgroundItem;

#if DBG
    for (currBackgroundItem = this->backgroundParseItems;
        currBackgroundItem;
        currBackgroundItem = currBackgroundItem->GetNext())
    {
        if (currBackgroundItem->RegExpNodeList())
        {
            FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnode, currBackgroundItem->RegExpNodeList())
            {
                Assert(pnode->AsParseNodeRegExp()->regexPattern == nullptr);
            }
            NEXT_DLIST_ENTRY;
        }
    }
#endif

    // Hook up the patterns allocated on the main thread to the nodes created on the background thread.
    // Walk the list of foreground nodes, advancing through the work items and looking up each item.
    // Note that the background thread may have chosen to defer a given RegEx literal, so not every foreground
    // node will have a matching background node. Doesn't matter for correctness.
    // (It's inefficient, of course, to have to restart the inner loop from the beginning of the work item's
    // list, but it should be unusual to have many RegExes in a single work item's chunk of code. Figure out how
    // to start the inner loop from a known internal node within the list if that turns out to be important.)
    currBackgroundItem = this->backgroundParseItems;
    FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnodeFgnd, this->fastScannedRegExpNodes)
    {
        Assert(pnodeFgnd->nop == knopRegExp);
        Assert(pnodeFgnd->AsParseNodeRegExp()->regexPattern != nullptr);
        bool quit = false;

        while (!quit)
        {
            // Find the next work item with a RegEx in it.
            while (currBackgroundItem && currBackgroundItem->RegExpNodeList() == nullptr)
            {
                currBackgroundItem = currBackgroundItem->GetNext();
            }
            if (!currBackgroundItem)
            {
                break;
            }

            // Walk the RegExps in the work item.
            FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnodeBgnd, currBackgroundItem->RegExpNodeList())
            {
                Assert(pnodeBgnd->nop == knopRegExp);

                if (pnodeFgnd->ichMin <= pnodeBgnd->ichMin)
                {
                    // Either we found a match, or the next background node is past the foreground node.
                    // In any case, we can stop searching.
                    if (pnodeFgnd->ichMin == pnodeBgnd->ichMin)
                    {
                        Assert(pnodeFgnd->ichLim == pnodeBgnd->ichLim);
                        pnodeBgnd->AsParseNodeRegExp()->regexPattern = pnodeFgnd->AsParseNodeRegExp()->regexPattern;
                    }
                    quit = true;
                    break;
                }
            }
            NEXT_DLIST_ENTRY;

            if (!quit)
            {
                // Need to advance to the next work item.
                currBackgroundItem = currBackgroundItem->GetNext();
            }
        }
    }
    NEXT_DLIST_ENTRY;

#if DBG
    for (currBackgroundItem = this->backgroundParseItems;
        currBackgroundItem;
        currBackgroundItem = currBackgroundItem->GetNext())
    {
        if (currBackgroundItem->RegExpNodeList())
        {
            FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnode, currBackgroundItem->RegExpNodeList())
            {
                Assert(pnode->AsParseNodeRegExp()->regexPattern != nullptr);
            }
            NEXT_DLIST_ENTRY;
        }
    }
#endif
}